

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  type_conflict5 tVar4;
  DataKey DVar5;
  uint i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  i = (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->thecovectors->set).thenum;
  while (0 < (int)i) {
    i = i - 1;
    pnVar2 = (((this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver)->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20);
    local_a8.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[i].m_backend.data;
    local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_a8.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_a8.m_backend.exp = pnVar2[i].m_backend.exp;
    local_a8.m_backend.neg = pnVar2[i].m_backend.neg;
    local_a8.m_backend.fpclass = pnVar2[i].m_backend.fpclass;
    local_a8.m_backend.prec_elem = pnVar2[i].m_backend.prec_elem;
    local_68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 8);
    local_68.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 6);
    local_68.m_backend.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    local_68.m_backend.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    local_68.m_backend.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    local_68.m_backend.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (local_68.m_backend.fpclass != cpp_dec_float_finite ||
        local_68.m_backend.data._M_elems[0] != 0) {
      local_68.m_backend.neg = (bool)(local_68.m_backend.neg ^ 1);
    }
    tVar4 = boost::multiprecision::operator<(&local_a8,&local_68);
    if (tVar4) {
      tVar4 = boost::multiprecision::operator<(&local_a8,best);
      if (tVar4) {
        DVar5 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,i);
        enterId->super_DataKey = DVar5;
        *(undefined8 *)(best->m_backend).data._M_elems = local_a8.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 2) =
             local_a8.m_backend.data._M_elems._8_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 4) =
             local_a8.m_backend.data._M_elems._16_8_;
        *(ulong *)((best->m_backend).data._M_elems + 6) =
             CONCAT35(local_a8.m_backend.data._M_elems[7]._1_3_,
                      local_a8.m_backend.data._M_elems._24_5_);
        *(ulong *)((best->m_backend).data._M_elems + 8) =
             CONCAT35(local_a8.m_backend.data._M_elems[9]._1_3_,
                      local_a8.m_backend.data._M_elems._32_5_);
        (best->m_backend).exp = local_a8.m_backend.exp;
        (best->m_backend).neg = local_a8.m_backend.neg;
        (best->m_backend).fpclass = local_a8.m_backend.fpclass;
        (best->m_backend).prec_elem = local_a8.m_backend.prec_elem;
      }
    }
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterDenseDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   R x;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->coTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId   = this->thesolver->coId(i);
            best = x;
         }
      }
   }

   return enterId;
}